

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_filter.cpp
# Opt level: O3

void __thiscall tst_helpers_filter::delayedRejected(tst_helpers_filter *this)

{
  long *plVar1;
  QSharedData *pQVar2;
  undefined4 uVar3;
  PromiseResolver<bool> PVar4;
  QArrayData *pQVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> QVar6;
  char cVar7;
  char16_t *pcVar8;
  PromiseData<bool> *pPVar9;
  QObject *pQVar10;
  int *piVar11;
  QEvent *this_00;
  PromiseData<QList<int>_> *pPVar12;
  undefined **ppuVar13;
  QPromiseReject<QList<int>_> *reject;
  undefined **ppuVar14;
  long lVar15;
  bool bVar16;
  QByteArrayView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> local_150;
  PromiseResolver<bool> resolver;
  PromiseResolver<bool> resolver_1;
  QArrayData *d;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> QStack_130;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> local_128;
  PromiseData<bool> *local_120;
  _func_int **local_118;
  QArrayData *local_110;
  QString local_108;
  QPromise<QList<int>_> p;
  QPromise<bool> local_e0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> local_d0;
  QString local_c8;
  Data *local_b0;
  QPromise<bool> local_a8;
  vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_> promises;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_78;
  _func_int **local_58;
  _func_int **local_50;
  PromiseData<bool> *local_48;
  int *local_40;
  QObject *local_38;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_48 = (PromiseData<bool> *)QArrayData::allocate(&d,4,8,3,KeepSize);
  local_110 = d;
  (local_48->super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x2b0000002a;
  (local_48->super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData.ref.
  super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       0x2c;
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar15 = 0;
  ppuVar14 = &PTR__PromiseDataBase_001355f8;
  ppuVar13 = &PTR__PromiseData_00135580;
  local_b0 = (Data *)&PTR__QPromiseBase_00135518;
  local_50 = (_func_int **)&PTR__PromiseDataBase_001355f8;
  local_58 = (_func_int **)&PTR__PromiseData_00135580;
  do {
    local_108.d.d = (Data *)&PTR__QPromiseBase_00135560;
    pcVar8 = (char16_t *)operator_new(0x68);
    pcVar8[0] = L'\0';
    pcVar8[1] = L'\0';
    pcVar8[2] = L'\0';
    pcVar8[3] = L'\0';
    pcVar8[4] = L'\0';
    pcVar8[5] = L'\0';
    pcVar8[6] = L'\0';
    pcVar8[7] = L'\0';
    pcVar8[0x28] = L'\0';
    pcVar8[0x29] = L'\0';
    pcVar8[0x2a] = L'\0';
    pcVar8[0x2b] = L'\0';
    pcVar8[0x2c] = L'\0';
    pcVar8[0x2d] = L'\0';
    pcVar8[0x2e] = L'\0';
    pcVar8[0x2f] = L'\0';
    pcVar8[0x20] = L'\0';
    pcVar8[0x21] = L'\0';
    pcVar8[0x22] = L'\0';
    pcVar8[0x23] = L'\0';
    pcVar8[0x24] = L'\0';
    pcVar8[0x25] = L'\0';
    pcVar8[0x26] = L'\0';
    pcVar8[0x27] = L'\0';
    pcVar8[0x18] = L'\0';
    pcVar8[0x19] = L'\0';
    pcVar8[0x1a] = L'\0';
    pcVar8[0x1b] = L'\0';
    pcVar8[0x1c] = L'\0';
    pcVar8[0x1d] = L'\0';
    pcVar8[0x1e] = L'\0';
    pcVar8[0x1f] = L'\0';
    pcVar8[0x10] = L'\0';
    pcVar8[0x11] = L'\0';
    pcVar8[0x12] = L'\0';
    pcVar8[0x13] = L'\0';
    pcVar8[0x14] = L'\0';
    pcVar8[0x15] = L'\0';
    pcVar8[0x16] = L'\0';
    pcVar8[0x17] = L'\0';
    pcVar8[8] = L'\0';
    pcVar8[9] = L'\0';
    pcVar8[10] = L'\0';
    pcVar8[0xb] = L'\0';
    pcVar8[0xc] = L'\0';
    pcVar8[0xd] = L'\0';
    pcVar8[0xe] = L'\0';
    pcVar8[0xf] = L'\0';
    pcVar8[0x30] = L'\0';
    pcVar8[0x31] = L'\0';
    pcVar8[0x32] = L'\0';
    pcVar8[0x33] = L'\0';
    *(undefined ***)pcVar8 = ppuVar14;
    QReadWriteLock::QReadWriteLock((QReadWriteLock *)(pcVar8 + 8),0);
    *(undefined1 *)(pcVar8 + 0xc) = 0;
    pcVar8[0x10] = L'\0';
    pcVar8[0x11] = L'\0';
    pcVar8[0x12] = L'\0';
    pcVar8[0x13] = L'\0';
    pcVar8[0x14] = L'\0';
    pcVar8[0x15] = L'\0';
    pcVar8[0x16] = L'\0';
    pcVar8[0x17] = L'\0';
    pcVar8[0x18] = L'\0';
    pcVar8[0x19] = L'\0';
    pcVar8[0x1a] = L'\0';
    pcVar8[0x1b] = L'\0';
    pcVar8[0x1c] = L'\0';
    pcVar8[0x1d] = L'\0';
    pcVar8[0x1e] = L'\0';
    pcVar8[0x1f] = L'\0';
    pcVar8[0x20] = L'\0';
    pcVar8[0x21] = L'\0';
    pcVar8[0x22] = L'\0';
    pcVar8[0x23] = L'\0';
    pcVar8[0x24] = L'\0';
    pcVar8[0x25] = L'\0';
    pcVar8[0x26] = L'\0';
    pcVar8[0x27] = L'\0';
    pcVar8[0x28] = L'\0';
    pcVar8[0x29] = L'\0';
    pcVar8[0x2a] = L'\0';
    pcVar8[0x2b] = L'\0';
    *(undefined ***)pcVar8 = ppuVar13;
    pcVar8[0x2c] = L'\0';
    pcVar8[0x2d] = L'\0';
    pcVar8[0x2e] = L'\0';
    pcVar8[0x2f] = L'\0';
    pcVar8[0x30] = L'\0';
    pcVar8[0x31] = L'\0';
    pcVar8[0x32] = L'\0';
    pcVar8[0x33] = L'\0';
    LOCK();
    *(int *)(pcVar8 + 4) = *(int *)(pcVar8 + 4) + 1;
    UNLOCK();
    if (pcVar8 != (char16_t *)0x0) {
      LOCK();
      *(int *)(pcVar8 + 4) = *(int *)(pcVar8 + 4) + 1;
      UNLOCK();
    }
    local_78.super__Function_base._M_functor._M_unused._M_object = local_b0;
    local_108.d.ptr = pcVar8;
    local_78.super__Function_base._M_functor._8_8_ = pcVar8;
    QtPromisePrivate::PromiseResolver<bool>::PromiseResolver(&resolver,(QPromise<bool> *)&local_78);
    local_78.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00135560;
    if ((long *)local_78.super__Function_base._M_functor._8_8_ != (long *)0x0) {
      LOCK();
      plVar1 = (long *)(local_78.super__Function_base._M_functor._8_8_ + 8);
      *(int *)plVar1 = *(int *)plVar1 + -1;
      UNLOCK();
      if ((*(int *)plVar1 == 0) &&
         ((long *)local_78.super__Function_base._M_functor._8_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_78.super__Function_base._M_functor._8_8_ + 8))();
      }
    }
    if (resolver.m_d.d == (Data *)0x0) {
      local_150.d = (Data *)0x0;
LAB_00108289:
      local_d0.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      local_150 = resolver.m_d.d;
      if (resolver.m_d.d == (Data *)0x0) goto LAB_00108289;
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      local_d0 = resolver.m_d.d;
    }
    uVar3 = *(undefined4 *)
             ((long)&(local_48->super_PromiseDataBase<bool,_void_(const_bool_&)>).
                     _vptr_PromiseDataBase + lVar15);
    local_e0.super_QPromiseBase<bool>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00135560
    ;
    pPVar9 = (PromiseData<bool> *)operator_new(0x68);
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData = 0
    ;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar9->m_value).m_data.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.size = 0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.size = 0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
    *(undefined8 *)&(pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_settled = 0;
    (pPVar9->m_value).m_data.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase =
         (_func_int **)ppuVar14;
    QReadWriteLock::QReadWriteLock
              (&(pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_lock,0);
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_settled = false;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_handlers.d.size = 0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_catchers.d.size = 0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase =
         (_func_int **)ppuVar13;
    (pPVar9->m_value).m_data.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar9->m_value).m_data.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LOCK();
    pQVar2 = &(pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar9 != (PromiseData<bool> *)0x0) {
      LOCK();
      pQVar2 = &(pPVar9->super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.super_QPromiseBase<bool>._vptr_QPromiseBase = (_func_int **)local_b0;
    local_e0.super_QPromiseBase<bool>.m_d.d = pPVar9;
    local_a8.super_QPromiseBase<bool>.m_d.d = pPVar9;
    QtPromisePrivate::PromiseResolver<bool>::PromiseResolver(&resolver_1,&local_a8);
    local_a8.super_QPromiseBase<bool>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00135560
    ;
    if (local_a8.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0) {
      LOCK();
      pQVar2 = &((local_a8.super_QPromiseBase<bool>.m_d.d)->
                super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (local_a8.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0)) {
        (*((local_a8.super_QPromiseBase<bool>.m_d.d)->
          super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    PVar4.m_d.d = resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      QStack_130.d = (Data *)0x0;
      local_128.d = (Data *)0x0;
      bVar16 = true;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      bVar16 = resolver_1.m_d.d == (Data *)0x0;
      if (bVar16) {
        QStack_130.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
        QStack_130 = resolver_1.m_d.d;
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
      }
      local_128 = resolver_1.m_d.d;
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    QVar6.d = local_128.d;
    d = (QArrayData *)CONCAT44((int)((ulong)d >> 0x20),uVar3);
    pQVar10 = (QObject *)QThread::currentThread();
    if ((pQVar10 != (QObject *)0x0) &&
       (piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar10),
       local_40 = piVar11, local_38 = pQVar10, piVar11 != (int *)0x0)) {
      if ((piVar11[1] != 0) && (cVar7 = QThread::isFinished(), cVar7 == '\0')) {
        if (piVar11[1] == 0) {
          pQVar10 = (QObject *)0x0;
        }
        pQVar10 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar10);
        if ((pQVar10 != (QObject *)0x0) || (cVar7 = QCoreApplication::closingDown(), cVar7 == '\0'))
        {
          this_00 = (QEvent *)operator_new(0x28);
          QEvent::QEvent(this_00,None);
          *(undefined ***)this_00 = &PTR__Event_00135298;
          *(undefined4 *)(this_00 + 0x10) = d._0_4_;
          *(Data **)(this_00 + 0x18) = QStack_130.d;
          if (QStack_130.d != (Data *)0x0) {
            LOCK();
            ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          *(Data **)(this_00 + 0x20) = local_128.d;
          if (local_128.d != (Data *)0x0) {
            LOCK();
            ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QCoreApplication::postEvent(pQVar10,this_00,0);
          piVar11 = local_40;
          if (local_40 == (int *)0x0) goto LAB_001084dd;
        }
      }
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        piVar11 = local_40;
        if (local_40 == (int *)0x0) {
          piVar11 = (int *)0x0;
        }
        operator_delete(piVar11);
      }
    }
LAB_001084dd:
    if (local_128.d != (Data *)0x0) {
      LOCK();
      ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_128.d,0x10);
      }
    }
    if (QStack_130.d != (Data *)0x0) {
      LOCK();
      ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_130.d,0x10);
      }
    }
    if (!bVar16) {
      LOCK();
      ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QVar6.d,0x10);
      }
    }
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver_1.m_d.d == 0) {
        operator_delete((void *)resolver_1.m_d.d,0x10);
      }
    }
    ppuVar14 = local_50;
    ppuVar13 = local_58;
    local_e0.super_QPromiseBase<bool>._vptr_QPromiseBase = (_func_int **)local_b0;
    QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<bool>>::
    call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>
              (&local_e0,(QPromiseResolve<bool> *)&local_150,(QPromiseReject<bool> *)&local_d0);
    local_e0.super_QPromiseBase<bool>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00135560
    ;
    if (local_e0.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0) {
      LOCK();
      pQVar2 = &((local_e0.super_QPromiseBase<bool>.m_d.d)->
                super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (local_e0.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0)) {
        (*((local_e0.super_QPromiseBase<bool>.m_d.d)->
          super_PromiseDataBase<bool,_void_(const_bool_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    if (local_d0.d != (Data *)0x0) {
      LOCK();
      ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
        operator_delete(local_d0.d,0x10);
      }
    }
    if (local_150.d != (Data *)0x0) {
      LOCK();
      ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_150.d,0x10);
      }
    }
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver.m_d.d == 0) {
        operator_delete((void *)resolver.m_d.d,0x10);
      }
    }
    local_108.d.d = local_b0;
    std::vector<QtPromise::QPromise<bool>,std::allocator<QtPromise::QPromise<bool>>>::
    emplace_back<QtPromise::QPromise<bool>>
              ((vector<QtPromise::QPromise<bool>,std::allocator<QtPromise::QPromise<bool>>> *)
               &promises,(QPromise<bool> *)&local_108);
    local_108.d.d = (Data *)&PTR__QPromiseBase_00135560;
    if (local_108.d.ptr != (char16_t *)0x0) {
      LOCK();
      pcVar8 = local_108.d.ptr + 4;
      *(int *)pcVar8 = *(int *)pcVar8 + -1;
      UNLOCK();
      if ((*(int *)pcVar8 == 0) && (local_108.d.ptr != (char16_t *)0x0)) {
        (**(code **)(*(long *)local_108.d.ptr + 8))();
      }
    }
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0xc);
  QtPromise::all<bool,_std::vector,_std::allocator<QtPromise::QPromise<bool>_>_>
            ((QtPromise *)&local_c8,&promises);
  std::vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>::~vector
            (&promises);
  if (local_110 != (QArrayData *)0x0) {
    LOCK();
    (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_110->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001354e8;
  pPVar12 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0
  ;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled
       = 0;
  (pPVar12->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00135978;
  QReadWriteLock::QReadWriteLock
            (&(pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00135910;
  (pPVar12->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar12 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar12->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108.d.d = (Data *)&PTR__QPromiseBase_001358d8;
  local_108.d.ptr = (char16_t *)pPVar12;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar12;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            ((PromiseResolver<QList<int>_> *)&resolver_1,(QPromise<QList<int>_> *)&local_108);
  local_108.d.d = (Data *)&PTR__QPromiseBase_001354e8;
  if ((PromiseData<QList<int>_> *)local_108.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_108.d.ptr)->
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_108.d.ptr != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_108.d.ptr)->
        _vptr_PromiseDataBase[1])();
    }
  }
  pcVar8 = local_c8.d.ptr;
  if (resolver_1.m_d.d == (Data *)0x0) {
    d = (QArrayData *)0x0;
    QStack_130.d = (Data *)0x0;
    goto LAB_00108a3c;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_150.d = (Data *)0x0;
LAB_00108a27:
    d = (QArrayData *)resolver_1.m_d.d;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    QStack_130.d = local_150.d;
    if ((PromiseData<bool> *)local_150.d == (PromiseData<bool> *)0x0) goto LAB_00108a3c;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_150 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_00108a27;
  }
  d = (QArrayData *)resolver_1.m_d.d;
  LOCK();
  (((QAtomicInt *)
   &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(local_150.d)->super_QSharedData)->
    _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (((QAtomicInt *)
        &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(local_150.d)->super_QSharedData)->
         _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  QStack_130.d = local_150.d;
LAB_00108a3c:
  local_128.d = (Data *)local_110;
  local_120 = local_48;
  local_118 = (_func_int **)0x3;
  if (local_110 != (QArrayData *)0x0) {
    LOCK();
    (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_110->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.d = QStack_130.d;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>)d;
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x28);
  ((promises.
    super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_QPromiseBase<bool>)._vptr_QPromiseBase =
       (_func_int **)d;
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((promises.
    super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_QPromiseBase<bool>).m_d.d =
       (PromiseData<bool> *)QStack_130.d;
  if ((PromiseData<bool> *)QStack_130.d != (PromiseData<bool> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(QStack_130.d)->super_QSharedData)->
      _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (((QAtomicInt *)
          &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(QStack_130.d)->super_QSharedData)->
           _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super_QPromiseBase<bool>._vptr_QPromiseBase =
       (_func_int **)local_128.d;
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super_QPromiseBase<bool>.m_d.d = local_120;
  promises.
  super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super_QPromiseBase<bool>._vptr_QPromiseBase = local_118;
  if ((QArrayData *)local_128.d == (QArrayData *)0x0) {
    promises.
    super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_manager;
  }
  else {
    LOCK();
    (((QBasicAtomicInt *)&(local_128.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_128.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
    promises.
    super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_manager;
    if ((QArrayData *)local_128.d != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_128.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_128.d)->super_QSharedData)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_128.d)->super_QSharedData)->_q_value).
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_128.d,4,8);
      }
    }
  }
  if ((PromiseData<bool> *)QStack_130.d != (PromiseData<bool> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(QStack_130.d)->super_QSharedData)->
      _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (((QAtomicInt *)
          &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(QStack_130.d)->super_QSharedData)->
           _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QAtomicInt *)
         &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(QStack_130.d)->super_QSharedData)->
          _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value
        .super___atomic_base<int>._M_i == 0) {
      operator_delete(QStack_130.d,0x10);
    }
  }
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::addHandler
            ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)pcVar8,
             (function<void_(const_QList<bool>_&)> *)&promises);
  if (promises.
      super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)promises.
              super__Vector_base<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(&promises,&promises,3);
  }
  pcVar8 = local_c8.d.ptr;
  QtPromisePrivate::PromiseCatcher<QList<bool>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            (&local_78,(PromiseCatcher<QList<bool>,decltype(nullptr),void> *)0x0,&resolver,
             (QPromiseResolve<QList<int>_> *)&local_150,reject);
  QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::addCatcher
            ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)pcVar8,&local_78);
  if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.super__Function_base._M_manager)
              ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  if ((PromiseData<bool> *)local_150.d != (PromiseData<bool> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(local_150.d)->super_QSharedData)->
      _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (((QAtomicInt *)
           &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(local_150.d)->super_QSharedData)->
            _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (((QAtomicInt *)
         &((PromiseDataBase<bool,_void_(const_bool_&)> *)&(local_150.d)->super_QSharedData)->
          _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value
        .super___atomic_base<int> == 0) {
      operator_delete(local_150.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  pcVar8 = local_c8.d.ptr;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001358d8;
  bVar16 = QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::isPending
                     ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_c8.d.ptr);
  if (!bVar16) {
    QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::dispatch
              ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)pcVar8);
  }
  pQVar5 = local_110;
  if (local_110 != (QArrayData *)0x0) {
    LOCK();
    (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_110,4,8);
    }
  }
  local_c8.d.d = (Data *)&PTR__QPromiseBase_001356e0;
  if ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_c8.d.ptr !=
      (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)0x0) {
    LOCK();
    pQVar2 = (QSharedData *)((long)local_c8.d.ptr + 8);
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_c8.d.ptr !=
        (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)0x0)) {
      (*(*(_func_int ***)local_c8.d.ptr)[1])();
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,4,8);
    }
  }
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.size = 0;
  waitForError<QList<int>,QString>(&local_108,&p,&local_c8);
  QVar17.m_data = (storage_type *)0x3;
  QVar17.m_size = (qsizetype)&d;
  QString::fromUtf8(QVar17);
  pQVar5 = d;
  QVar18.m_data = local_108.d.ptr;
  QVar18.m_size = local_108.d.size;
  QVar19.m_data = (storage_type_conflict *)QStack_130.d;
  QVar19.m_size = (qsizetype)local_128.d;
  QTest::qCompare(QVar18,QVar19,"waitForError(p, QString{})","QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_filter.cpp"
                  ,100);
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,8);
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001354e8;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_filter::sequenceTypes()
{
    SequenceTester<QList<int>>::exec();
    SequenceTester<QVector<int>>::exec();
    SequenceTester<std::list<int>>::exec();
    SequenceTester<std::vector<int>>::exec();
}